

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TiledRgbaOutputFile::writeTile(TiledRgbaOutputFile *this,int dx,int dy,int lx,int ly)

{
  mutex_type *in_RDI;
  lock_guard<std::mutex> lock;
  int in_stack_000002a0;
  int in_stack_000002a4;
  int in_stack_000002a8;
  int in_stack_000002ac;
  ToYa *in_stack_000002b0;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  TiledOutputFile *in_stack_ffffffffffffffe0;
  
  if (*(long *)((long)&(in_RDI->super___mutex_base)._M_mutex + 0x10) == 0) {
    TiledOutputFile::writeTile
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI);
    ToYa::writeTile(in_stack_000002b0,in_stack_000002ac,in_stack_000002a8,in_stack_000002a4,
                    in_stack_000002a0);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x24c916);
  }
  return;
}

Assistant:

void
TiledRgbaOutputFile::writeTile (int dx, int dy, int lx, int ly)
{
    if (_toYa)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_toYa);
#endif
        _toYa->writeTile (dx, dy, lx, ly);
    }
    else { _outputFile->writeTile (dx, dy, lx, ly); }
}